

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O0

bool __thiscall xemmai::io::t_writer::f_resume(t_writer *this,t_io *a_library)

{
  anon_class_16_2_29d16f4a a_do;
  bool bVar1;
  t_io *local_18;
  t_io *a_library_local;
  t_writer *this_local;
  
  a_do.a_library = &local_18;
  a_do.this = this;
  local_18 = a_library;
  a_library_local = (t_io *)this;
  bVar1 = t_sharable::
          f_owned_or_shared<xemmai::t_lock_with_safe_region,xemmai::io::t_writer::f_resume(xemmai::t_io*)::__0>
                    (&this->super_t_sharable,a_do);
  return bVar1;
}

Assistant:

bool t_writer::f_resume(t_io* a_library)
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		if (!v_stream) f_throw(L"already closed."sv);
		return f__resume(a_library);
	});
}